

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deSocketResult deSocket_receive(deSocket *sock,void *buf,size_t bufSize,size_t *numReceivedPtr)

{
  int numBytes;
  deSocketResult dVar1;
  ssize_t sVar2;
  size_t local_38;
  deSocketResult result;
  int numRecv;
  size_t *numReceivedPtr_local;
  size_t bufSize_local;
  void *buf_local;
  deSocket *sock_local;
  
  sVar2 = recv(sock->handle,buf,bufSize,0);
  numBytes = (int)sVar2;
  dVar1 = mapSendRecvResult(numBytes);
  if (numReceivedPtr != (size_t *)0x0) {
    if (numBytes < 1) {
      local_38 = 0;
    }
    else {
      local_38 = (size_t)numBytes;
    }
    *numReceivedPtr = local_38;
  }
  if (dVar1 == DE_SOCKETRESULT_CONNECTION_CLOSED) {
    deSocket_setChannelsClosed(sock,1);
  }
  else if (dVar1 == DE_SOCKETRESULT_CONNECTION_TERMINATED) {
    deSocket_setChannelsClosed(sock,3);
  }
  return dVar1;
}

Assistant:

deSocketResult deSocket_receive (deSocket* sock, void* buf, size_t bufSize, size_t* numReceivedPtr)
{
	int				numRecv	= (int)recv(sock->handle, (char*)buf, (NativeSize)bufSize, 0);
	deSocketResult	result	= mapSendRecvResult(numRecv);

	if (numReceivedPtr)
		*numReceivedPtr = (numRecv > 0) ? ((size_t)numRecv) : (0);

	/* Update state. */
	if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_RECEIVE);
	else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_BOTH);

	return result;
}